

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,char *fileName,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  StdIFStream *this_00;
  InputStreamMutex *pIVar3;
  undefined4 extraout_var;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_0315fe00;
  pDVar2 = (Data *)operator_new(0x180);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_streamData = (InputStreamMutex *)0x0;
  pDVar2->_deleteStream = true;
  this_00 = (StdIFStream *)operator_new(0x38);
  StdIFStream::StdIFStream(this_00,fileName);
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(IStream *)this_00,&this->_data->version);
  pDVar2 = this->_data;
  if ((pDVar2->version & 0x1000) == 0) {
    pIVar3 = (InputStreamMutex *)operator_new(0x38);
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar3->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pIVar3->currentPosition = 0;
    pDVar2->_streamData = pIVar3;
    pIVar3->is = (IStream *)this_00;
    Header::readFrom(&pDVar2->header,(IStream *)this_00,&pDVar2->version);
    initialize(this);
    pDVar2 = this->_data;
    TileOffsets::readFrom
              (&pDVar2->tileOffsets,pDVar2->_streamData->is,&pDVar2->fileIsComplete,false,false);
    iVar1 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar1);
  }
  else {
    compatibilityInitialize(this,(IStream *)this_00);
  }
  return;
}

Assistant:

TiledInputFile::TiledInputFile (const char fileName[], int numThreads):
    _data (new Data (numThreads))
{
    _data->_streamData=NULL;
    _data->_deleteStream=true;
    
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //


    IStream* is = 0;
    try
    {
        try
        {
            is = new StdIFStream (fileName);
            readMagicNumberAndVersionField(*is, _data->version);

            //
            // Backward compatibility to read multpart file.
            //
            if (isMultiPart(_data->version))
            {
                compatibilityInitialize(*is);
                return;
            }

            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            //read tile offsets - we are not multipart or deep
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,false);
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
        catch (IEX_NAMESPACE::BaseExc &e)
        {
            REPLACE_EXC (e, "Cannot open image file "
                    "\"" << fileName << "\". " << e.what());
            throw;
        }
    }
    catch (...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        if ( _data->_streamData != 0 && !isMultiPart(_data->version))
        {
            delete _data->_streamData->is;
            _data->_streamData->is = is = 0;
            delete _data->_streamData;
        }

        delete is;
        delete _data;
        throw;
    }
}